

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

dataflags NodeContext_FindDataType(tchar_t *Type,tchar_t *Format)

{
  bool_t bVar1;
  ulong uVar2;
  tchar_t **pptVar3;
  long lVar4;
  
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0x2a) {
      return 0;
    }
    if (((0x1e1c9436800U >> (uVar2 & 0x3f) & 1) == 0) &&
       (bVar1 = tcsisame_ascii(Type,ParamName[uVar2]), bVar1 != 0)) break;
    uVar2 = uVar2 + 1;
  }
  if (Format != (tchar_t *)0x0) {
    if (*Format == '\0') {
      return uVar2;
    }
    lVar4 = -0x1000000;
    pptVar3 = ParamFormat;
    while( true ) {
      pptVar3 = pptVar3 + 1;
      if (lVar4 == -0x20000000) {
        return uVar2;
      }
      if ((*pptVar3 != (tchar_t *)0x0) && (bVar1 = tcsisame_ascii(Format,*pptVar3), bVar1 != 0))
      break;
      lVar4 = lVar4 + -0x1000000;
    }
    return uVar2 - lVar4;
  }
  return uVar2;
}

Assistant:

dataflags NodeContext_FindDataType(const tchar_t* Type, const tchar_t* Format)
{
    dataflags i;
    for (i=0;i<MAX_PARAMTYPE;++i)
        if (ParamName[i] && tcsisame_ascii(Type,ParamName[i]))
        {
            if (Format && Format[0])
            {
                dataflags j;
                for (j=1;(j<<TUNIT_SHIFT) & TUNIT_MASK;++j)
                    if (ParamFormat[j] && tcsisame_ascii(Format,ParamFormat[j]))
                    {
                        i |= j<<TUNIT_SHIFT;
                        break;
                    }
            }
            return i;
        }
    return 0;
}